

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O2

void __thiscall
TopologicalSortTest_Chain_Test::~TopologicalSortTest_Chain_Test
          (TopologicalSortTest_Chain_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TopologicalSortTest, Chain) {
  constexpr Index n = 10;
  Graph graph(n);
  for (Index i = 1; i < n; ++i) {
    graph[i].push_back(i - 1);
  }
  TopologicalOrders orders(graph);
  std::set<std::vector<Index>> results(orders.begin(), orders.end());
  std::set<std::vector<Index>> expected{{9, 8, 7, 6, 5, 4, 3, 2, 1, 0}};
  EXPECT_EQ(results, expected);
}